

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O2

void mathCore::to_DNF(expression *a)

{
  expSet *this;
  _Rb_tree_header *p_Var1;
  const_iterator __position;
  bool bVar2;
  ostream *poVar3;
  iterator iVar4;
  expression *a_00;
  expression *peVar5;
  expression *child;
  expSet tempSet;
  expression *big_term;
  expression *local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Base_ptr local_48;
  _Base_ptr local_40;
  expression *local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"DNF CALLED WITH ");
  as_string_abi_cxx11_((string *)local_68,(mathCore *)a,a_00);
  poVar3 = std::operator<<(poVar3,(string *)local_68);
  peVar5 = (expression *)0x10b615;
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)local_68);
  bVar2 = is_DNF(a);
  if (bVar2) {
    recursive_idempotent((mathCore *)a,peVar5);
    return;
  }
  bVar2 = is_or(a);
  if (((!bVar2) || (bVar2 = is_dualed(a), bVar2)) || (bVar2 = is_negated(a), bVar2)) {
    bVar2 = is_and(a);
    if (!bVar2) {
      return;
    }
    bVar2 = is_dualed(a);
    if (bVar2) {
      return;
    }
    bVar2 = is_negated(a);
    if (bVar2) {
      return;
    }
    local_58._8_8_ = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_58._M_allocated_capacity = 0;
    local_40 = (_Base_ptr)0x0;
    this = &a->contents;
    iVar4._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(a->contents)._M_t._M_impl.super__Rb_tree_header;
    local_48 = (_Base_ptr)local_58._8_8_;
    while ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      local_70 = *(expression **)(iVar4._M_node + 1);
      iVar4 = std::
              _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                  *)this,iVar4._M_node);
      to_CNF(local_70);
      std::
      _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
      ::_M_insert_equal<expression*const&>
                ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  *)local_68,&local_70);
    }
    peVar5 = (expression *)local_68;
    mergeMultiSet(this,(expSet *)peVar5);
    recursive_combine_and(a);
    idempotent_law((mathCore *)a,peVar5);
    universal_bound(a);
    bVar2 = is_DNF(a);
    if (!bVar2) {
      __position._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      peVar5 = *(expression **)(__position._M_node + 1);
      local_38 = peVar5;
      iVar4 = std::
              _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                  *)this,__position);
      while ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
        local_70 = *(expression **)(iVar4._M_node + 1);
        iVar4 = std::
                _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                    *)this,iVar4._M_node);
        do_expansion(a,peVar5,local_70);
      }
      peVar5 = (expression *)&local_38;
      std::
      _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
      ::_M_insert_equal<expression*const&>
                ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  *)this,(expression **)peVar5);
      empty_expression((mathCore *)a,peVar5);
    }
  }
  else {
    local_58._8_8_ = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_58._M_allocated_capacity = 0;
    local_40 = (_Base_ptr)0x0;
    iVar4._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_48 = (_Base_ptr)local_58._8_8_;
    while ((_Rb_tree_header *)iVar4._M_node != &(a->contents)._M_t._M_impl.super__Rb_tree_header) {
      local_70 = *(expression **)(iVar4._M_node + 1);
      iVar4 = std::
              _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                  *)&a->contents,iVar4._M_node);
      to_DNF(local_70);
      std::
      _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
      ::_M_insert_equal<expression*const&>
                ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  *)local_68,&local_70);
    }
    peVar5 = (expression *)local_68;
    mergeMultiSet(&a->contents,(expSet *)peVar5);
    combine_or(a);
    idempotent_law((mathCore *)a,peVar5);
    universal_bound(a);
  }
  std::
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  ::~_Rb_tree((_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
               *)local_68);
  return;
}

Assistant:

void mathCore::to_DNF(expression *a) {
	
	std::cout << "DNF CALLED WITH " << as_string(a) << "\n";

	if (mathCore::is_DNF(a)) { // If we are already a DNF just return!
		// Normally you need to be a minimized one, we don't bother doing that!
		recursive_idempotent(a);
		return;
	}
	else if (mathCore::is_or(a) && !(is_dualed(a) || is_negated(a))) {
		// If we are an OR statement then fancy things can happen

		expSet tempSet;
		expression* child;
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);

			to_DNF(child);
			tempSet.insert(child);
		}
		mergeMultiSet(a->contents, tempSet);
		// Our children now are DNFED!

		// Pull our children up together
		combine_or(a);
		// The only simplifcation we do is idempotent
		mathCore::idempotent_law(a);
		mathCore::universal_bound(a);

		/*
		Need Quine�McCluskey algorithm or Similar here
		Currently its dumb!
		*/
	}
	else if (mathCore::is_and(a) && !(is_dualed(a) || is_negated(a))) {
		// If we are an and statement
		expSet tempSet;
		expression* child;
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);

			to_CNF(child);
			tempSet.insert(child);
		}
		mergeMultiSet(a->contents, tempSet);
		// Our children now are CNFED!
		// First pull them all up into ourselves
		recursive_combine_and(a);
		mathCore::idempotent_law(a);
		mathCore::universal_bound(a);

		// If we became a valid DNF return
		if (is_DNF(a)) {
			return;
		}

		// We aren't a valid DNF, so something needs to be expanded
		// Iter is definitinitly a sum
		iter = a->contents.begin();
		expression* big_term = *iter;
		iter = a->contents.erase(iter);

		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);
			do_expansion(a, big_term, child);
		}

		// Put only big term back!
		a->contents.insert(big_term);
		empty_expression(a);	// Transmuting call!
	}
}